

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O0

void af_latin_metrics_init_blues(AF_LatinMetrics metrics,FT_Face face)

{
  ulong uVar1;
  bool bVar2;
  FT_Int FVar3;
  FT_Error FVar4;
  int iVar5;
  long lVar6;
  bool local_5aa;
  bool local_5a9;
  long local_5a8;
  long local_5a0;
  long local_598;
  long local_590;
  long local_588;
  long local_580;
  long local_578;
  long local_570;
  long local_568;
  long local_560;
  long local_558;
  long local_550;
  long local_548;
  FT_ULong local_540;
  FT_ULong local_538;
  long local_530;
  AF_LatinBlue local_528;
  FT_Pos *b;
  FT_Pos *a;
  AF_LatinBlue blue_sorted [10];
  uint local_4c0;
  FT_UInt i_1;
  FT_Bool over_ref;
  FT_Pos shoot;
  FT_Pos ref;
  FT_Pos d;
  FT_Bool l2r;
  int iStack_498;
  FT_Bool left2right;
  FT_Int p_last;
  FT_Int p_first;
  int iStack_48c;
  FT_Bool hit;
  FT_Int last_1;
  FT_Int first_1;
  FT_Pos height_threshold;
  FT_Pos length_threshold;
  FT_Pos dist;
  FT_Int best_on_point_last;
  FT_Int best_on_point_first;
  FT_Int best_segment_last;
  FT_Int best_segment_first;
  FT_Int next;
  FT_Int prev;
  FT_Pos best_x;
  FT_Int pp;
  FT_Int old_best_point;
  FT_Int last;
  FT_Int first;
  FT_Int nn;
  FT_Bool round;
  FT_Pos best_y;
  uint local_428;
  uint num_idx;
  uint i;
  FT_Bool best_round;
  FT_Pos best_y_extremum;
  FT_Vector *points;
  int local_408;
  FT_Int best_contour_last;
  FT_Int best_contour_first;
  FT_Int best_point;
  FT_Long y_offset;
  FT_ULong glyph_index;
  FT_Pos descender;
  FT_Pos ascender;
  FT_Pos *blue_shoot;
  FT_Pos *blue_ref;
  char *p;
  void *shaper_buf;
  FT_Pos flat_threshold;
  AF_Blue_StringRec *bs;
  AF_StyleClass pAStack_3a8;
  AF_Blue_Stringset bss;
  AF_StyleClass sc;
  FT_Outline outline;
  AF_LatinAxis axis;
  FT_Error error;
  AF_LatinBlue blue;
  FT_UInt num_rounds;
  FT_UInt num_flats;
  FT_Pos rounds [51];
  FT_Pos local_1b8;
  FT_Pos flats [51];
  FT_Face face_local;
  AF_LatinMetrics metrics_local;
  
  outline._32_8_ = metrics->axis + 1;
  pAStack_3a8 = (metrics->root).style_class;
  bs._4_4_ = pAStack_3a8->blue_stringset;
  flat_threshold = (FT_Pos)(af_blue_stringsets + bs._4_4_);
  shaper_buf = (void *)((ulong)metrics->units_per_em / 0xe);
  p = (char *)af_shaper_buf_create(face);
  do {
    if (*(int *)flat_threshold == 0x1429) {
      af_shaper_buf_destroy(face,p);
      if (*(int *)(outline._32_8_ + 0x1ac) != 0) {
        for (local_4c0 = 0; local_4c0 < *(uint *)(outline._32_8_ + 0x1ac); local_4c0 = local_4c0 + 1
            ) {
          blue_sorted[(ulong)local_4c0 - 1] =
               (AF_LatinBlue)(outline._32_8_ + 0x1b0 + (ulong)local_4c0 * 0x48);
        }
        af_latin_sort_blue(*(FT_UInt *)(outline._32_8_ + 0x1ac),(AF_LatinBlue *)&a);
        for (local_4c0 = 0; local_4c0 < *(int *)(outline._32_8_ + 0x1ac) - 1U;
            local_4c0 = local_4c0 + 1) {
          if ((blue_sorted[(ulong)local_4c0 - 1]->flags & 6) == 0) {
            b = (FT_Pos *)blue_sorted[(ulong)local_4c0 - 1];
          }
          else {
            b = &(blue_sorted[(ulong)local_4c0 - 1]->shoot).org;
          }
          if ((blue_sorted[(ulong)(local_4c0 + 1) - 1]->flags & 6) == 0) {
            local_528 = blue_sorted[(ulong)(local_4c0 + 1) - 1];
          }
          else {
            local_528 = (AF_LatinBlue)&blue_sorted[(ulong)(local_4c0 + 1) - 1]->shoot;
          }
          if ((local_528->ref).org < *b) {
            *b = (local_528->ref).org;
          }
        }
      }
      return;
    }
    blue_ref = (FT_Pos *)(af_blue_strings + *(uint *)flat_threshold);
    blue._4_4_ = 0;
    blue._0_4_ = 0;
    descender = 0;
    glyph_index = 0;
    while ((char)*blue_ref != '\0') {
      num_idx._3_1_ = '\0';
      for (; (char)*blue_ref == ' '; blue_ref = (FT_Pos *)((long)blue_ref + 1)) {
      }
      blue_ref = (FT_Pos *)
                 af_shaper_get_cluster
                           ((char *)blue_ref,&metrics->root,p,(uint *)((long)&best_y + 4));
      if (best_y._4_4_ != 0) {
        if ((*(ushort *)(flat_threshold + 4) & 1) == 0) {
          _i = 0x7fffffff;
        }
        else {
          _i = -0x80000000;
        }
        local_428 = 0;
LAB_0035ef0a:
        if (local_428 < best_y._4_4_) {
          first._3_1_ = false;
          y_offset = af_shaper_get_elem(&metrics->root,p,local_428,(FT_Long *)0x0,
                                        (FT_Long *)&best_contour_first);
          if (y_offset != 0) {
            FVar4 = FT_Load_Glyph(face,(FT_UInt)y_offset,1);
            memcpy(&sc,&face->glyph->outline,0x28);
            if ((FVar4 != 0) || (sc._2_2_ < 3)) goto LAB_0036023c;
            best_y_extremum._0_2_ = outline.n_contours;
            best_y_extremum._2_2_ = outline.n_points;
            best_y_extremum._4_4_ = outline._4_4_;
            best_contour_last = -1;
            _nn = 0;
            local_408 = 0;
            points._4_4_ = 0;
            old_best_point = 0;
            for (last = 0; FVar3 = best_contour_last, last < (short)sc; last = last + 1) {
              iVar5 = (int)*(short *)(outline.tags + (long)last * 2);
              if (old_best_point < iVar5) {
                if (((*(ushort *)(flat_threshold + 4) & 1) == 0) &&
                   ((*(ushort *)(flat_threshold + 4) & 2) == 0)) {
                  for (best_x._0_4_ = old_best_point; (int)best_x <= iVar5;
                      best_x._0_4_ = (int)best_x + 1) {
                    if ((best_contour_last < 0) ||
                       (*(long *)(outline._0_8_ + (long)(int)best_x * 0x10 + 8) < _nn)) {
                      best_contour_last = (int)best_x;
                      _nn = *(long *)(outline._0_8_ + (long)(int)best_x * 0x10 + 8);
                      if ((long)glyph_index < _nn + _best_contour_first) {
                        local_540 = glyph_index;
                      }
                      else {
                        local_540 = _nn + _best_contour_first;
                      }
                      glyph_index = local_540;
                    }
                    else {
                      if (*(long *)(outline._0_8_ + (long)(int)best_x * 0x10 + 8) +
                          _best_contour_first < descender) {
                        local_548 = descender;
                      }
                      else {
                        local_548 = *(long *)(outline._0_8_ + (long)(int)best_x * 0x10 + 8) +
                                    _best_contour_first;
                      }
                      descender = local_548;
                    }
                  }
                }
                else {
                  for (best_x._0_4_ = old_best_point; (int)best_x <= iVar5;
                      best_x._0_4_ = (int)best_x + 1) {
                    if ((best_contour_last < 0) ||
                       (_nn < *(long *)(outline._0_8_ + (long)(int)best_x * 0x10 + 8))) {
                      best_contour_last = (int)best_x;
                      _nn = *(long *)(outline._0_8_ + (long)(int)best_x * 0x10 + 8);
                      if (_nn + _best_contour_first < descender) {
                        local_530 = descender;
                      }
                      else {
                        local_530 = _nn + _best_contour_first;
                      }
                      descender = local_530;
                    }
                    else {
                      if ((long)glyph_index <
                          *(long *)(outline._0_8_ + (long)(int)best_x * 0x10 + 8) +
                          _best_contour_first) {
                        local_538 = glyph_index;
                      }
                      else {
                        local_538 = *(long *)(outline._0_8_ + (long)(int)best_x * 0x10 + 8) +
                                    _best_contour_first;
                      }
                      glyph_index = local_538;
                    }
                  }
                }
                if (best_contour_last != FVar3) {
                  local_408 = old_best_point;
                  points._4_4_ = iVar5;
                }
              }
              old_best_point = iVar5 + 1;
            }
            if (-1 < best_contour_last) {
              lVar6 = *(long *)(outline._0_8_ + (long)best_contour_last * 0x10);
              if ((*(byte *)((long)&(outline.points)->x + (long)best_contour_last) & 3) == 1) {
                dist._4_4_ = best_contour_last;
              }
              else {
                dist._4_4_ = -1;
              }
              best_segment_first = best_contour_last;
              best_segment_last = best_contour_last;
              dist._0_4_ = dist._4_4_;
              do {
                best_on_point_first = best_segment_first;
                if (local_408 < best_segment_first) {
                  best_segment_first = best_segment_first + -1;
                }
                else {
                  best_segment_first = points._4_4_;
                }
                if (*(long *)(outline._0_8_ + (long)best_segment_first * 0x10 + 8) - _nn < 0) {
                  local_550 = -(*(long *)(outline._0_8_ + (long)best_segment_first * 0x10 + 8) - _nn
                               );
                }
                else {
                  local_550 = *(long *)(outline._0_8_ + (long)best_segment_first * 0x10 + 8) - _nn;
                }
                if (5 < local_550) {
                  if (*(long *)(outline._0_8_ + (long)best_segment_first * 0x10) - lVar6 < 0) {
                    local_558 = -(*(long *)(outline._0_8_ + (long)best_segment_first * 0x10) - lVar6
                                 );
                  }
                  else {
                    local_558 = *(long *)(outline._0_8_ + (long)best_segment_first * 0x10) - lVar6;
                  }
                  if (local_558 == local_550 * 0x14 ||
                      SBORROW8(local_558,local_550 * 0x14) != local_558 + local_550 * -0x14 < 0)
                  break;
                }
                best_on_point_first = best_segment_first;
                if (((*(byte *)((long)&(outline.points)->x + (long)best_segment_first) & 3) == 1) &&
                   (dist._4_4_ = best_segment_first, (int)dist < 0)) {
                  dist._0_4_ = best_segment_first;
                }
              } while (best_segment_first != best_contour_last);
              do {
                best_on_point_last = best_segment_last;
                if (best_segment_last < points._4_4_) {
                  best_segment_last = best_segment_last + 1;
                }
                else {
                  best_segment_last = local_408;
                }
                if (*(long *)(outline._0_8_ + (long)best_segment_last * 0x10 + 8) - _nn < 0) {
                  local_560 = -(*(long *)(outline._0_8_ + (long)best_segment_last * 0x10 + 8) - _nn)
                  ;
                }
                else {
                  local_560 = *(long *)(outline._0_8_ + (long)best_segment_last * 0x10 + 8) - _nn;
                }
                if (5 < local_560) {
                  if (*(long *)(outline._0_8_ + (long)best_segment_last * 0x10) - lVar6 < 0) {
                    local_568 = -(*(long *)(outline._0_8_ + (long)best_segment_last * 0x10) - lVar6)
                    ;
                  }
                  else {
                    local_568 = *(long *)(outline._0_8_ + (long)best_segment_last * 0x10) - lVar6;
                  }
                  if (local_568 == local_560 * 0x14 ||
                      SBORROW8(local_568,local_560 * 0x14) != local_568 + local_560 * -0x14 < 0)
                  break;
                }
                best_on_point_last = best_segment_last;
                if (((*(byte *)((long)&(outline.points)->x + (long)best_segment_last) & 3) == 1) &&
                   (dist._0_4_ = best_segment_last, dist._4_4_ < 0)) {
                  dist._4_4_ = best_segment_last;
                }
              } while (best_segment_last != best_contour_last);
              if ((*(ushort *)(flat_threshold + 4) & 0x10) != 0) {
                uVar1 = (ulong)metrics->units_per_em / 0x19;
                if (*(long *)(outline._0_8_ + (long)best_on_point_last * 0x10) -
                    *(long *)(outline._0_8_ + (long)best_on_point_first * 0x10) < 0) {
                  local_570 = -(*(long *)(outline._0_8_ + (long)best_on_point_last * 0x10) -
                               *(long *)(outline._0_8_ + (long)best_on_point_first * 0x10));
                }
                else {
                  local_570 = *(long *)(outline._0_8_ + (long)best_on_point_last * 0x10) -
                              *(long *)(outline._0_8_ + (long)best_on_point_first * 0x10);
                }
                if ((local_570 < (long)uVar1) &&
                   ((best_on_point_last - best_on_point_first) + 2 <= points._4_4_ - local_408)) {
                  iStack_498 = 0;
                  d._4_4_ = 0;
                  best_segment_first = best_contour_last;
                  do {
                    if (local_408 < best_segment_first) {
                      best_segment_first = best_segment_first + -1;
                    }
                    else {
                      best_segment_first = points._4_4_;
                    }
                  } while ((*(long *)(outline._0_8_ + (long)best_segment_first * 0x10) == lVar6) &&
                          (best_segment_first != best_contour_last));
                  if (best_segment_first == best_contour_last) goto LAB_0036023c;
                  iStack_48c = best_on_point_last;
                  p_first = best_on_point_last;
                  bVar2 = false;
                  do {
                    if (!bVar2) {
                      iStack_48c = p_first;
                      if ((*(byte *)((long)&(outline.points)->x + (long)p_first) & 3) == 1) {
                        iStack_498 = p_first;
                      }
                      else {
                        iStack_498 = -1;
                      }
                      bVar2 = true;
                      d._4_4_ = iStack_498;
                    }
                    if (p_first < points._4_4_) {
                      p_first = p_first + 1;
                    }
                    else {
                      p_first = local_408;
                    }
                    if (_nn - *(long *)(outline._0_8_ + (long)iStack_48c * 0x10 + 8) < 0) {
                      local_578 = -(_nn - *(long *)(outline._0_8_ + (long)iStack_48c * 0x10 + 8));
                    }
                    else {
                      local_578 = _nn - *(long *)(outline._0_8_ + (long)iStack_48c * 0x10 + 8);
                    }
                    if ((long)(ulong)(metrics->units_per_em >> 2) < local_578) {
                      bVar2 = false;
                    }
                    else {
                      if (*(long *)(outline._0_8_ + (long)p_first * 0x10 + 8) -
                          *(long *)(outline._0_8_ + (long)iStack_48c * 0x10 + 8) < 0) {
                        local_580 = -(*(long *)(outline._0_8_ + (long)p_first * 0x10 + 8) -
                                     *(long *)(outline._0_8_ + (long)iStack_48c * 0x10 + 8));
                      }
                      else {
                        local_580 = *(long *)(outline._0_8_ + (long)p_first * 0x10 + 8) -
                                    *(long *)(outline._0_8_ + (long)iStack_48c * 0x10 + 8);
                      }
                      if (5 < local_580) {
                        if (*(long *)(outline._0_8_ + (long)p_first * 0x10) -
                            *(long *)(outline._0_8_ + (long)iStack_48c * 0x10) < 0) {
                          local_588 = -(*(long *)(outline._0_8_ + (long)p_first * 0x10) -
                                       *(long *)(outline._0_8_ + (long)iStack_48c * 0x10));
                        }
                        else {
                          local_588 = *(long *)(outline._0_8_ + (long)p_first * 0x10) -
                                      *(long *)(outline._0_8_ + (long)iStack_48c * 0x10);
                        }
                        if (local_588 == local_580 * 0x14 ||
                            SBORROW8(local_588,local_580 * 0x14) !=
                            local_588 + local_580 * -0x14 < 0) {
                          bVar2 = false;
                          goto LAB_00360047;
                        }
                      }
                      if (((*(byte *)((long)&(outline.points)->x + (long)p_first) & 3) == 1) &&
                         (d._4_4_ = p_first, iStack_498 < 0)) {
                        iStack_498 = p_first;
                      }
                      if (*(long *)(outline._0_8_ + (long)p_first * 0x10) -
                          *(long *)(outline._0_8_ + (long)iStack_48c * 0x10) < 0) {
                        local_590 = -(*(long *)(outline._0_8_ + (long)p_first * 0x10) -
                                     *(long *)(outline._0_8_ + (long)iStack_48c * 0x10));
                      }
                      else {
                        local_590 = *(long *)(outline._0_8_ + (long)p_first * 0x10) -
                                    *(long *)(outline._0_8_ + (long)iStack_48c * 0x10);
                      }
                      if ((*(long *)(outline._0_8_ + (long)iStack_48c * 0x10) <
                           *(long *)(outline._0_8_ + (long)p_first * 0x10) ==
                           *(long *)(outline._0_8_ + (long)best_segment_first * 0x10) <
                           *(long *)(outline._0_8_ + (long)best_contour_last * 0x10)) &&
                         ((long)uVar1 <= local_590)) goto LAB_0035fdb0;
                    }
LAB_00360047:
                  } while (p_first != best_on_point_first);
                }
              }
              goto LAB_0036005d;
            }
            goto LAB_003601cf;
          }
          goto LAB_0036023c;
        }
        if ((_i != -0x80000000) && (_i != 0x7fffffff)) {
          if (num_idx._3_1_ == '\0') {
            flats[(ulong)blue._4_4_ - 1] = _i;
            blue._4_4_ = blue._4_4_ + 1;
          }
          else {
            *(long *)(&num_rounds + (ulong)(FT_UInt)blue * 2) = _i;
            blue._0_4_ = (FT_UInt)blue + 1;
          }
        }
      }
    }
    if ((blue._4_4_ != 0) || ((FT_UInt)blue != 0)) {
      af_sort_pos((FT_UInt)blue,(FT_Pos *)&num_rounds);
      af_sort_pos(blue._4_4_,&local_1b8);
      blue_shoot = (FT_Pos *)
                   (outline._32_8_ + 0x1b0 + (ulong)*(uint *)(outline._32_8_ + 0x1ac) * 0x48);
      ascender = (FT_Pos)(blue_shoot + 3);
      *(int *)(outline._32_8_ + 0x1ac) = *(int *)(outline._32_8_ + 0x1ac) + 1;
      if (blue._4_4_ == 0) {
        lVar6 = *(long *)(&num_rounds + (ulong)((FT_UInt)blue >> 1) * 2);
        *(long *)ascender = lVar6;
        *blue_shoot = lVar6;
      }
      else if ((FT_UInt)blue == 0) {
        lVar6 = flats[(ulong)(blue._4_4_ >> 1) - 1];
        *(long *)ascender = lVar6;
        *blue_shoot = lVar6;
      }
      else {
        *blue_shoot = flats[(ulong)(blue._4_4_ >> 1) - 1];
        *(long *)ascender = *(long *)(&num_rounds + (ulong)((FT_UInt)blue >> 1) * 2);
      }
      if (*(long *)ascender != *blue_shoot) {
        local_5aa = true;
        if ((*(ushort *)(flat_threshold + 4) & 1) == 0) {
          local_5aa = (*(ushort *)(flat_threshold + 4) & 2) != 0;
        }
        if (local_5aa != *blue_shoot < *(long *)ascender) {
          lVar6 = (*(long *)ascender + *blue_shoot) / 2;
          *(long *)ascender = lVar6;
          *blue_shoot = lVar6;
        }
      }
      blue_shoot[6] = descender;
      blue_shoot[7] = glyph_index;
      *(undefined4 *)(blue_shoot + 8) = 0;
      if ((*(ushort *)(flat_threshold + 4) & 1) != 0) {
        *(uint *)(blue_shoot + 8) = *(uint *)(blue_shoot + 8) | 2;
      }
      if ((*(ushort *)(flat_threshold + 4) & 2) != 0) {
        *(uint *)(blue_shoot + 8) = *(uint *)(blue_shoot + 8) | 4;
      }
      if ((*(ushort *)(flat_threshold + 4) & 4) != 0) {
        *(uint *)(blue_shoot + 8) = *(uint *)(blue_shoot + 8) | 8;
      }
      if ((*(ushort *)(flat_threshold + 4) & 8) != 0) {
        *(uint *)(blue_shoot + 8) = *(uint *)(blue_shoot + 8) | 0x10;
      }
    }
    flat_threshold = flat_threshold + 8;
  } while( true );
  while( true ) {
    if (((*(byte *)((long)&(outline.points)->x + (long)p_first) & 3) == 1) && (iStack_498 < 0)) {
      iStack_498 = p_first;
    }
    d._4_4_ = p_first;
    if (p_first == best_on_point_first) break;
LAB_0035fdb0:
    if (p_first < points._4_4_) {
      p_first = p_first + 1;
    }
    else {
      p_first = local_408;
    }
    if (*(long *)(outline._0_8_ + (long)p_first * 0x10 + 8) -
        *(long *)(outline._0_8_ + (long)iStack_48c * 0x10 + 8) < 0) {
      local_598 = -(*(long *)(outline._0_8_ + (long)p_first * 0x10 + 8) -
                   *(long *)(outline._0_8_ + (long)iStack_48c * 0x10 + 8));
    }
    else {
      local_598 = *(long *)(outline._0_8_ + (long)p_first * 0x10 + 8) -
                  *(long *)(outline._0_8_ + (long)iStack_48c * 0x10 + 8);
    }
    if (5 < local_598) {
      if (*(long *)(outline._0_8_ + (long)best_segment_last * 0x10) -
          *(long *)(outline._0_8_ + (long)iStack_48c * 0x10) < 0) {
        local_5a0 = -(*(long *)(outline._0_8_ + (long)best_segment_last * 0x10) -
                     *(long *)(outline._0_8_ + (long)iStack_48c * 0x10));
      }
      else {
        local_5a0 = *(long *)(outline._0_8_ + (long)best_segment_last * 0x10) -
                    *(long *)(outline._0_8_ + (long)iStack_48c * 0x10);
      }
      if (local_5a0 == local_580 * 0x14 ||
          SBORROW8(local_5a0,local_580 * 0x14) != local_5a0 + local_580 * -0x14 < 0) {
        if (local_408 < p_first) {
          p_first = p_first + -1;
        }
        else {
          p_first = points._4_4_;
        }
        break;
      }
    }
  }
  _nn = *(long *)(outline._0_8_ + (long)iStack_48c * 0x10 + 8);
  best_on_point_first = iStack_48c;
  best_on_point_last = p_first;
  dist._4_4_ = iStack_498;
  dist._0_4_ = d._4_4_;
LAB_0036005d:
  _nn = _best_contour_first + _nn;
  if ((-1 < dist._4_4_) && (-1 < (int)dist)) {
    if (*(long *)(outline._0_8_ + (long)(int)dist * 0x10) -
        *(long *)(outline._0_8_ + (long)dist._4_4_ * 0x10) < 0) {
      local_5a8 = -(*(long *)(outline._0_8_ + (long)(int)dist * 0x10) -
                   *(long *)(outline._0_8_ + (long)dist._4_4_ * 0x10));
    }
    else {
      local_5a8 = *(long *)(outline._0_8_ + (long)(int)dist * 0x10) -
                  *(long *)(outline._0_8_ + (long)dist._4_4_ * 0x10);
    }
    if ((long)shaper_buf < local_5a8) {
      first._3_1_ = false;
      goto LAB_003601a4;
    }
  }
  local_5a9 = true;
  if ((*(byte *)((long)&(outline.points)->x + (long)best_on_point_first) & 3) == 1) {
    local_5a9 = (*(byte *)((long)&(outline.points)->x + (long)best_on_point_last) & 3) != 1;
  }
  first._3_1_ = local_5a9;
LAB_003601a4:
  if ((first._3_1_ == false) || ((*(ushort *)(flat_threshold + 4) & 4) == 0)) {
LAB_003601cf:
    if ((*(ushort *)(flat_threshold + 4) & 1) == 0) {
      if (_nn < _i) {
        _i = _nn;
        num_idx._3_1_ = first._3_1_;
      }
    }
    else if (_i < _nn) {
      _i = _nn;
      num_idx._3_1_ = first._3_1_;
    }
  }
LAB_0036023c:
  local_428 = local_428 + 1;
  goto LAB_0035ef0a;
}

Assistant:

static void
  af_latin_metrics_init_blues( AF_LatinMetrics  metrics,
                               FT_Face          face )
  {
    FT_Pos        flats [AF_BLUE_STRING_MAX_LEN];
    FT_Pos        rounds[AF_BLUE_STRING_MAX_LEN];

    FT_UInt       num_flats;
    FT_UInt       num_rounds;

    AF_LatinBlue  blue;
    FT_Error      error;
    AF_LatinAxis  axis = &metrics->axis[AF_DIMENSION_VERT];
    FT_Outline    outline;

    AF_StyleClass  sc = metrics->root.style_class;

    AF_Blue_Stringset         bss = sc->blue_stringset;
    const AF_Blue_StringRec*  bs  = &af_blue_stringsets[bss];

    FT_Pos  flat_threshold = FLAT_THRESHOLD( metrics->units_per_em );

    void*  shaper_buf;


    /* we walk over the blue character strings as specified in the */
    /* style's entry in the `af_blue_stringset' array              */

    FT_TRACE5(( "latin blue zones computation\n"
                "============================\n"
                "\n" ));

    shaper_buf = af_shaper_buf_create( face );

    for ( ; bs->string != AF_BLUE_STRING_MAX; bs++ )
    {
      const char*  p = &af_blue_strings[bs->string];
      FT_Pos*      blue_ref;
      FT_Pos*      blue_shoot;
      FT_Pos       ascender;
      FT_Pos       descender;


#ifdef FT_DEBUG_LEVEL_TRACE
      {
        FT_Bool  have_flag = 0;


        FT_TRACE5(( "blue zone %d", axis->blue_count ));

        if ( bs->properties )
        {
          FT_TRACE5(( " (" ));

          if ( AF_LATIN_IS_TOP_BLUE( bs ) )
          {
            FT_TRACE5(( "top" ));
            have_flag = 1;
          }
          else if ( AF_LATIN_IS_SUB_TOP_BLUE( bs ) )
          {
            FT_TRACE5(( "sub top" ));
            have_flag = 1;
          }

          if ( AF_LATIN_IS_NEUTRAL_BLUE( bs ) )
          {
            if ( have_flag )
              FT_TRACE5(( ", " ));
            FT_TRACE5(( "neutral" ));
            have_flag = 1;
          }

          if ( AF_LATIN_IS_X_HEIGHT_BLUE( bs ) )
          {
            if ( have_flag )
              FT_TRACE5(( ", " ));
            FT_TRACE5(( "small top" ));
            have_flag = 1;
          }

          if ( AF_LATIN_IS_LONG_BLUE( bs ) )
          {
            if ( have_flag )
              FT_TRACE5(( ", " ));
            FT_TRACE5(( "long" ));
          }

          FT_TRACE5(( ")" ));
        }

        FT_TRACE5(( ":\n" ));
      }
#endif /* FT_DEBUG_LEVEL_TRACE */

      num_flats  = 0;
      num_rounds = 0;
      ascender   = 0;
      descender  = 0;

      while ( *p )
      {
        FT_ULong    glyph_index;
        FT_Long     y_offset;
        FT_Int      best_point, best_contour_first, best_contour_last;
        FT_Vector*  points;

        FT_Pos   best_y_extremum;                      /* same as points.y */
        FT_Bool  best_round = 0;

        unsigned int  i, num_idx;

#ifdef FT_DEBUG_LEVEL_TRACE
        const char*  p_old;
        FT_ULong     ch;
#endif


        while ( *p == ' ' )
          p++;

#ifdef FT_DEBUG_LEVEL_TRACE
        p_old = p;
        GET_UTF8_CHAR( ch, p_old );
#endif

        p = af_shaper_get_cluster( p, &metrics->root, shaper_buf, &num_idx );

        if ( !num_idx )
        {
          FT_TRACE5(( "  U+%04lX unavailable\n", ch ));
          continue;
        }

        if ( AF_LATIN_IS_TOP_BLUE( bs ) )
          best_y_extremum = FT_INT_MIN;
        else
          best_y_extremum = FT_INT_MAX;

        /* iterate over all glyph elements of the character cluster */
        /* and get the data of the `biggest' one                    */
        for ( i = 0; i < num_idx; i++ )
        {
          FT_Pos   best_y;
          FT_Bool  round = 0;


          /* load the character in the face -- skip unknown or empty ones */
          glyph_index = af_shaper_get_elem( &metrics->root,
                                            shaper_buf,
                                            i,
                                            NULL,
                                            &y_offset );
          if ( glyph_index == 0 )
          {
            FT_TRACE5(( "  U+%04lX unavailable\n", ch ));
            continue;
          }

          error   = FT_Load_Glyph( face, glyph_index, FT_LOAD_NO_SCALE );
          outline = face->glyph->outline;
          /* reject glyphs that don't produce any rendering */
          if ( error || outline.n_points <= 2 )
          {
#ifdef FT_DEBUG_LEVEL_TRACE
            if ( num_idx == 1 )
              FT_TRACE5(( "  U+%04lX contains no (usable) outlines\n", ch ));
            else
              FT_TRACE5(( "  component %d of cluster starting with U+%04lX"
                          " contains no (usable) outlines\n", i, ch ));
#endif
            continue;
          }

          /* now compute min or max point indices and coordinates */
          points             = outline.points;
          best_point         = -1;
          best_y             = 0;  /* make compiler happy */
          best_contour_first = 0;  /* ditto */
          best_contour_last  = 0;  /* ditto */

          {
            FT_Int  nn;
            FT_Int  first = 0;
            FT_Int  last  = -1;


            for ( nn = 0; nn < outline.n_contours; first = last + 1, nn++ )
            {
              FT_Int  old_best_point = best_point;
              FT_Int  pp;


              last = outline.contours[nn];

              /* Avoid single-point contours since they are never      */
              /* rasterized.  In some fonts, they correspond to mark   */
              /* attachment points that are way outside of the glyph's */
              /* real outline.                                         */
              if ( last <= first )
                continue;

              if ( AF_LATIN_IS_TOP_BLUE( bs )     ||
                   AF_LATIN_IS_SUB_TOP_BLUE( bs ) )
              {
                for ( pp = first; pp <= last; pp++ )
                {
                  if ( best_point < 0 || points[pp].y > best_y )
                  {
                    best_point = pp;
                    best_y     = points[pp].y;
                    ascender   = FT_MAX( ascender, best_y + y_offset );
                  }
                  else
                    descender = FT_MIN( descender, points[pp].y + y_offset );
                }
              }
              else
              {
                for ( pp = first; pp <= last; pp++ )
                {
                  if ( best_point < 0 || points[pp].y < best_y )
                  {
                    best_point = pp;
                    best_y     = points[pp].y;
                    descender  = FT_MIN( descender, best_y + y_offset );
                  }
                  else
                    ascender = FT_MAX( ascender, points[pp].y + y_offset );
                }
              }

              if ( best_point != old_best_point )
              {
                best_contour_first = first;
                best_contour_last  = last;
              }
            }
          }

          /* now check whether the point belongs to a straight or round   */
          /* segment; we first need to find in which contour the extremum */
          /* lies, then inspect its previous and next points              */
          if ( best_point >= 0 )
          {
            FT_Pos  best_x = points[best_point].x;
            FT_Int  prev, next;
            FT_Int  best_segment_first, best_segment_last;
            FT_Int  best_on_point_first, best_on_point_last;
            FT_Pos  dist;


            best_segment_first = best_point;
            best_segment_last  = best_point;

            if ( FT_CURVE_TAG( outline.tags[best_point] ) == FT_CURVE_TAG_ON )
            {
              best_on_point_first = best_point;
              best_on_point_last  = best_point;
            }
            else
            {
              best_on_point_first = -1;
              best_on_point_last  = -1;
            }

            /* look for the previous and next points on the contour  */
            /* that are not on the same Y coordinate, then threshold */
            /* the `closeness'...                                    */
            prev = best_point;
            next = prev;

            do
            {
              if ( prev > best_contour_first )
                prev--;
              else
                prev = best_contour_last;

              dist = FT_ABS( points[prev].y - best_y );
              /* accept a small distance or a small angle (both values are */
              /* heuristic; value 20 corresponds to approx. 2.9 degrees)   */
              if ( dist > 5 )
                if ( FT_ABS( points[prev].x - best_x ) <= 20 * dist )
                  break;

              best_segment_first = prev;

              if ( FT_CURVE_TAG( outline.tags[prev] ) == FT_CURVE_TAG_ON )
              {
                best_on_point_first = prev;
                if ( best_on_point_last < 0 )
                  best_on_point_last = prev;
              }

            } while ( prev != best_point );

            do
            {
              if ( next < best_contour_last )
                next++;
              else
                next = best_contour_first;

              dist = FT_ABS( points[next].y - best_y );
              if ( dist > 5 )
                if ( FT_ABS( points[next].x - best_x ) <= 20 * dist )
                  break;

              best_segment_last = next;

              if ( FT_CURVE_TAG( outline.tags[next] ) == FT_CURVE_TAG_ON )
              {
                best_on_point_last = next;
                if ( best_on_point_first < 0 )
                  best_on_point_first = next;
              }

            } while ( next != best_point );

            if ( AF_LATIN_IS_LONG_BLUE( bs ) )
            {
              /* If this flag is set, we have an additional constraint to  */
              /* get the blue zone distance: Find a segment of the topmost */
              /* (or bottommost) contour that is longer than a heuristic   */
              /* threshold.  This ensures that small bumps in the outline  */
              /* are ignored (for example, the `vertical serifs' found in  */
              /* many Hebrew glyph designs).                               */

              /* If this segment is long enough, we are done.  Otherwise,  */
              /* search the segment next to the extremum that is long      */
              /* enough, has the same direction, and a not too large       */
              /* vertical distance from the extremum.  Note that the       */
              /* algorithm doesn't check whether the found segment is      */
              /* actually the one (vertically) nearest to the extremum.    */

              /* heuristic threshold value */
              FT_Pos  length_threshold = metrics->units_per_em / 25;


              dist = FT_ABS( points[best_segment_last].x -
                               points[best_segment_first].x );

              if ( dist < length_threshold                       &&
                   best_segment_last - best_segment_first + 2 <=
                     best_contour_last - best_contour_first      )
              {
                /* heuristic threshold value */
                FT_Pos  height_threshold = metrics->units_per_em / 4;

                FT_Int   first;
                FT_Int   last;
                FT_Bool  hit;

                /* we intentionally declare these two variables        */
                /* outside of the loop since various compilers emit    */
                /* incorrect warning messages otherwise, talking about */
                /* `possibly uninitialized variables'                  */
                FT_Int  p_first = 0;            /* make compiler happy */
                FT_Int  p_last  = 0;

                FT_Bool  left2right;


                /* compute direction */
                prev = best_point;

                do
                {
                  if ( prev > best_contour_first )
                    prev--;
                  else
                    prev = best_contour_last;

                  if ( points[prev].x != best_x )
                    break;

                } while ( prev != best_point );

                /* skip glyph for the degenerate case */
                if ( prev == best_point )
                  continue;

                left2right = FT_BOOL( points[prev].x < points[best_point].x );

                first = best_segment_last;
                last  = first;
                hit   = 0;

                do
                {
                  FT_Bool  l2r;
                  FT_Pos   d;


                  if ( !hit )
                  {
                    /* no hit; adjust first point */
                    first = last;

                    /* also adjust first and last on point */
                    if ( FT_CURVE_TAG( outline.tags[first] ) ==
                           FT_CURVE_TAG_ON )
                    {
                      p_first = first;
                      p_last  = first;
                    }
                    else
                    {
                      p_first = -1;
                      p_last  = -1;
                    }

                    hit = 1;
                  }

                  if ( last < best_contour_last )
                    last++;
                  else
                    last = best_contour_first;

                  if ( FT_ABS( best_y - points[first].y ) > height_threshold )
                  {
                    /* vertical distance too large */
                    hit = 0;
                    continue;
                  }

                  /* same test as above */
                  dist = FT_ABS( points[last].y - points[first].y );
                  if ( dist > 5 )
                    if ( FT_ABS( points[last].x - points[first].x ) <=
                           20 * dist )
                    {
                      hit = 0;
                      continue;
                    }

                  if ( FT_CURVE_TAG( outline.tags[last] ) == FT_CURVE_TAG_ON )
                  {
                    p_last = last;
                    if ( p_first < 0 )
                      p_first = last;
                  }

                  l2r = FT_BOOL( points[first].x < points[last].x );
                  d   = FT_ABS( points[last].x - points[first].x );

                  if ( l2r == left2right     &&
                       d >= length_threshold )
                  {
                    /* all constraints are met; update segment after */
                    /* finding its end                               */
                    do
                    {
                      if ( last < best_contour_last )
                        last++;
                      else
                        last = best_contour_first;

                      d = FT_ABS( points[last].y - points[first].y );
                      if ( d > 5 )
                        if ( FT_ABS( points[next].x - points[first].x ) <=
                               20 * dist )
                        {
                          if ( last > best_contour_first )
                            last--;
                          else
                            last = best_contour_last;
                          break;
                        }

                      p_last = last;

                      if ( FT_CURVE_TAG( outline.tags[last] ) ==
                             FT_CURVE_TAG_ON )
                      {
                        p_last = last;
                        if ( p_first < 0 )
                          p_first = last;
                      }

                    } while ( last != best_segment_first );

                    best_y = points[first].y;

                    best_segment_first = first;
                    best_segment_last  = last;

                    best_on_point_first = p_first;
                    best_on_point_last  = p_last;

                    break;
                  }

                } while ( last != best_segment_first );
              }
            }

            /* for computing blue zones, we add the y offset as returned */
            /* by the currently used OpenType feature -- for example,    */
            /* superscript glyphs might be identical to subscript glyphs */
            /* with a vertical shift                                     */
            best_y += y_offset;

#ifdef FT_DEBUG_LEVEL_TRACE
            if ( num_idx == 1 )
              FT_TRACE5(( "  U+%04lX: best_y = %5ld", ch, best_y ));
            else
              FT_TRACE5(( "  component %d of cluster starting with U+%04lX:"
                          " best_y = %5ld", i, ch, best_y ));
#endif

            /* now set the `round' flag depending on the segment's kind: */
            /*                                                           */
            /* - if the horizontal distance between the first and last   */
            /*   `on' point is larger than a heuristic threshold         */
            /*   we have a flat segment                                  */
            /* - if either the first or the last point of the segment is */
            /*   an `off' point, the segment is round, otherwise it is   */
            /*   flat                                                    */
            if ( best_on_point_first >= 0                               &&
                 best_on_point_last >= 0                                &&
                 ( FT_ABS( points[best_on_point_last].x -
                           points[best_on_point_first].x ) ) >
                   flat_threshold                                       )
              round = 0;
            else
              round = FT_BOOL(
                        FT_CURVE_TAG( outline.tags[best_segment_first] ) !=
                          FT_CURVE_TAG_ON                                   ||
                        FT_CURVE_TAG( outline.tags[best_segment_last]  ) !=
                          FT_CURVE_TAG_ON                                   );

            if ( round && AF_LATIN_IS_NEUTRAL_BLUE( bs ) )
            {
              /* only use flat segments for a neutral blue zone */
              FT_TRACE5(( " (round, skipped)\n" ));
              continue;
            }

            FT_TRACE5(( " (%s)\n", round ? "round" : "flat" ));
          }

          if ( AF_LATIN_IS_TOP_BLUE( bs ) )
          {
            if ( best_y > best_y_extremum )
            {
              best_y_extremum = best_y;
              best_round      = round;
            }
          }
          else
          {
            if ( best_y < best_y_extremum )
            {
              best_y_extremum = best_y;
              best_round      = round;
            }
          }

        } /* end for loop */

        if ( !( best_y_extremum == FT_INT_MIN ||
                best_y_extremum == FT_INT_MAX ) )
        {
          if ( best_round )
            rounds[num_rounds++] = best_y_extremum;
          else
            flats[num_flats++]   = best_y_extremum;
        }

      } /* end while loop */

      if ( num_flats == 0 && num_rounds == 0 )
      {
        /*
         *  we couldn't find a single glyph to compute this blue zone,
         *  we will simply ignore it then
         */
        FT_TRACE5(( "  empty\n" ));
        continue;
      }

      /* we have computed the contents of the `rounds' and `flats' tables, */
      /* now determine the reference and overshoot position of the blue -- */
      /* we simply take the median value after a simple sort               */
      af_sort_pos( num_rounds, rounds );
      af_sort_pos( num_flats,  flats );

      blue       = &axis->blues[axis->blue_count];
      blue_ref   = &blue->ref.org;
      blue_shoot = &blue->shoot.org;

      axis->blue_count++;

      if ( num_flats == 0 )
      {
        *blue_ref   =
        *blue_shoot = rounds[num_rounds / 2];
      }
      else if ( num_rounds == 0 )
      {
        *blue_ref   =
        *blue_shoot = flats[num_flats / 2];
      }
      else
      {
        *blue_ref   = flats [num_flats  / 2];
        *blue_shoot = rounds[num_rounds / 2];
      }

      /* there are sometimes problems: if the overshoot position of top     */
      /* zones is under its reference position, or the opposite for bottom  */
      /* zones.  We must thus check everything there and correct the errors */
      if ( *blue_shoot != *blue_ref )
      {
        FT_Pos   ref      = *blue_ref;
        FT_Pos   shoot    = *blue_shoot;
        FT_Bool  over_ref = FT_BOOL( shoot > ref );


        if ( ( AF_LATIN_IS_TOP_BLUE( bs )    ||
               AF_LATIN_IS_SUB_TOP_BLUE( bs) ) ^ over_ref )
        {
          *blue_ref   =
          *blue_shoot = ( shoot + ref ) / 2;

          FT_TRACE5(( "  [overshoot smaller than reference,"
                      " taking mean value]\n" ));
        }
      }

      blue->ascender  = ascender;
      blue->descender = descender;

      blue->flags = 0;
      if ( AF_LATIN_IS_TOP_BLUE( bs ) )
        blue->flags |= AF_LATIN_BLUE_TOP;
      if ( AF_LATIN_IS_SUB_TOP_BLUE( bs ) )
        blue->flags |= AF_LATIN_BLUE_SUB_TOP;
      if ( AF_LATIN_IS_NEUTRAL_BLUE( bs ) )
        blue->flags |= AF_LATIN_BLUE_NEUTRAL;

      /*
       * The following flag is used later to adjust the y and x scales
       * in order to optimize the pixel grid alignment of the top of small
       * letters.
       */
      if ( AF_LATIN_IS_X_HEIGHT_BLUE( bs ) )
        blue->flags |= AF_LATIN_BLUE_ADJUSTMENT;

      FT_TRACE5(( "    -> reference = %ld\n"
                  "       overshoot = %ld\n",
                  *blue_ref, *blue_shoot ));

    } /* end for loop */

    af_shaper_buf_destroy( face, shaper_buf );

    /* we finally check whether blue zones are ordered; */
    /* `ref' and `shoot' values of two blue zones must not overlap */
    if ( axis->blue_count )
    {
      FT_UInt       i;
      AF_LatinBlue  blue_sorted[AF_BLUE_STRINGSET_MAX_LEN + 2];


      for ( i = 0; i < axis->blue_count; i++ )
        blue_sorted[i] = &axis->blues[i];

      /* sort bottoms of blue zones... */
      af_latin_sort_blue( axis->blue_count, blue_sorted );

      /* ...and adjust top values if necessary */
      for ( i = 0; i < axis->blue_count - 1; i++ )
      {
        FT_Pos*  a;
        FT_Pos*  b;

#ifdef FT_DEBUG_LEVEL_TRACE
        FT_Bool  a_is_top = 0;
#endif


        if ( blue_sorted[i]->flags & ( AF_LATIN_BLUE_TOP     |
                                       AF_LATIN_BLUE_SUB_TOP ) )
        {
          a = &blue_sorted[i]->shoot.org;
#ifdef FT_DEBUG_LEVEL_TRACE
          a_is_top = 1;
#endif
        }
        else
          a = &blue_sorted[i]->ref.org;

        if ( blue_sorted[i + 1]->flags & ( AF_LATIN_BLUE_TOP     |
                                           AF_LATIN_BLUE_SUB_TOP ) )
          b = &blue_sorted[i + 1]->shoot.org;
        else
          b = &blue_sorted[i + 1]->ref.org;

        if ( *a > *b )
        {
          *a = *b;
          FT_TRACE5(( "blue zone overlap:"
                      " adjusting %s %d to %ld\n",
                      a_is_top ? "overshoot" : "reference",
                      blue_sorted[i] - axis->blues,
                      *a ));
        }
      }
    }

    FT_TRACE5(( "\n" ));

    return;
  }